

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.cc
# Opt level: O1

bool __thiscall
sptk::DiscreteCosineTransform::Run
          (DiscreteCosineTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  pointer pdVar1;
  FourierTransformInterface *pFVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  pointer pdVar10;
  size_t sVar11;
  double *pdVar12;
  long lVar13;
  size_type __new_size;
  
  iVar9 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[3])();
  if (((char)iVar9 == '\0') ||
     ((long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)this->dct_length_)) {
    cVar8 = '\0';
  }
  else {
    cVar7 = '\0';
    cVar8 = '\0';
    if ((((buffer != (Buffer *)0x0) &&
         (cVar8 = cVar7, imag_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
        (real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
       ((long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)this->dct_length_)) {
      iVar9 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[2])
                        ();
      this_00 = &buffer->fourier_transform_real_part_;
      __new_size = (size_type)iVar9;
      if ((long)(buffer->fourier_transform_real_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(buffer->fourier_transform_real_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      }
      this_01 = &buffer->fourier_transform_imag_part_;
      if ((long)(buffer->fourier_transform_imag_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(buffer->fourier_transform_imag_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
      }
      if ((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->dct_length_) {
        std::vector<double,_std::allocator<double>_>::resize
                  (real_part_output,(long)this->dct_length_);
      }
      if ((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->dct_length_) {
        std::vector<double,_std::allocator<double>_>::resize
                  (imag_part_output,(long)this->dct_length_);
      }
      pdVar1 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar11 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar1;
      if (sVar11 != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar1,sVar11);
      }
      pdVar1 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pdVar10 != pdVar1) {
        pdVar12 = (buffer->fourier_transform_real_part_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + -(long)this->dct_length_;
        do {
          pdVar3 = pdVar10 + -1;
          pdVar10 = pdVar10 + -1;
          *pdVar12 = *pdVar3;
          pdVar12 = pdVar12 + 1;
        } while (pdVar10 != pdVar1);
      }
      pdVar1 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar11 = (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar1;
      if (sVar11 != 0) {
        memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar1,sVar11);
      }
      pdVar1 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (pdVar10 != pdVar1) {
        pdVar12 = (buffer->fourier_transform_imag_part_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + -(long)this->dct_length_;
        do {
          pdVar3 = pdVar10 + -1;
          pdVar10 = pdVar10 + -1;
          *pdVar12 = *pdVar3;
          pdVar12 = pdVar12 + 1;
        } while (pdVar10 != pdVar1);
      }
      pFVar2 = (this->fourier_transform_).fourier_transform_;
      iVar9 = (*pFVar2->_vptr_FourierTransformInterface[5])(pFVar2,this_00,this_01);
      cVar8 = (char)iVar9;
      if ((cVar8 != '\0') && (iVar9 = this->dct_length_, 0 < (long)iVar9)) {
        pdVar1 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar10 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          pdVar1[lVar13] = pdVar3[lVar13] * pdVar5[lVar13] - pdVar6[lVar13] * pdVar4[lVar13];
          pdVar10[lVar13] = pdVar3[lVar13] * pdVar6[lVar13] + pdVar4[lVar13] * pdVar5[lVar13];
          lVar13 = lVar13 + 1;
        } while (iVar9 != lVar13);
      }
    }
  }
  return (bool)cVar8;
}

Assistant:

bool DiscreteCosineTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    DiscreteCosineTransform::Buffer* buffer) const {
  // Check inputs.
  if (!fourier_transform_.IsValid() ||
      real_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int dft_length(fourier_transform_.GetLength());
  if (buffer->fourier_transform_real_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_real_part_.resize(dft_length);
  }
  if (buffer->fourier_transform_imag_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_imag_part_.resize(dft_length);
  }
  if (real_part_output->size() != static_cast<std::size_t>(dct_length_)) {
    real_part_output->resize(dct_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(dct_length_)) {
    imag_part_output->resize(dct_length_);
  }

  std::copy(real_part_input.begin(), real_part_input.end(),
            buffer->fourier_transform_real_part_.begin());
  std::reverse_copy(real_part_input.begin(), real_part_input.end(),
                    buffer->fourier_transform_real_part_.end() - dct_length_);

  std::copy(imag_part_input.begin(), imag_part_input.end(),
            buffer->fourier_transform_imag_part_.begin());
  std::reverse_copy(imag_part_input.begin(), imag_part_input.end(),
                    buffer->fourier_transform_imag_part_.end() - dct_length_);

  if (!fourier_transform_.Run(&buffer->fourier_transform_real_part_,
                              &buffer->fourier_transform_imag_part_)) {
    return false;
  }

  double* discrete_cosine_transform_real_part_output(&((*real_part_output)[0]));
  double* discrete_cosine_transform_imag_part_output(&((*imag_part_output)[0]));
  const double* fourier_transform_real_part(
      &buffer->fourier_transform_real_part_[0]);
  const double* fourier_transform_imag_part(
      &buffer->fourier_transform_imag_part_[0]);
  const double* cosine_table(&(cosine_table_[0]));
  const double* sine_table(&(sine_table_[0]));

  for (int i(0); i < dct_length_; ++i) {
    discrete_cosine_transform_real_part_output[i] =
        fourier_transform_real_part[i] * cosine_table[i] -
        fourier_transform_imag_part[i] * sine_table[i];
    discrete_cosine_transform_imag_part_output[i] =
        fourier_transform_real_part[i] * sine_table[i] +
        fourier_transform_imag_part[i] * cosine_table[i];
  }

  return true;
}